

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dePoolArray.c
# Opt level: O3

deBool dePoolArray_reserve(dePoolArray *arr,int size)

{
  uint uVar1;
  int iVar2;
  int iVar3;
  void **ppvVar4;
  ulong uVar5;
  void *pvVar6;
  int iVar7;
  void **ppvVar8;
  int iVar9;
  int iVar10;
  long lVar11;
  
  iVar3 = arr->capacity;
  if (iVar3 <= size) {
    iVar9 = size + 0xf >> 4;
    if (arr->pageTableCapacity < iVar9) {
      iVar3 = arr->pageTableCapacity * 2;
      if (iVar3 <= iVar9) {
        iVar3 = iVar9;
      }
      ppvVar4 = (void **)deMemPool_alloc(arr->pool,(long)iVar3 << 3);
      if (ppvVar4 == (void **)0x0) {
        return 0;
      }
      uVar1 = arr->pageTableCapacity;
      uVar5 = 0;
      if (0 < (long)(int)uVar1) {
        do {
          ppvVar4[uVar5] = arr->pageTable[uVar5];
          uVar5 = uVar5 + 1;
        } while ((long)(int)uVar1 != uVar5);
        uVar5 = (ulong)uVar1;
      }
      if ((int)(uint)uVar5 < iVar3) {
        memset(ppvVar4 + uVar5,0,(ulong)(~(uint)uVar5 + iVar3) * 8 + 8);
      }
      ppvVar8 = arr->pageTable;
      iVar7 = uVar1 * 8;
      arr->pageTable = ppvVar4;
      arr->pageTableCapacity = iVar3;
      iVar3 = arr->capacity;
    }
    else {
      iVar7 = 0;
      ppvVar8 = (void **)0x0;
    }
    iVar2 = arr->elementSize;
    iVar10 = iVar2 * 0x10;
    iVar3 = iVar3 >> 4;
    for (; iVar10 <= iVar7; iVar7 = iVar7 + iVar2 * -0x10) {
      lVar11 = (long)iVar3;
      iVar3 = iVar3 + 1;
      arr->pageTable[lVar11] = ppvVar8;
      ppvVar8 = (void **)((long)ppvVar8 + (long)iVar10);
    }
    if (iVar3 < iVar9) {
      lVar11 = (long)iVar3;
      do {
        pvVar6 = deMemPool_alloc(arr->pool,(long)iVar10);
        if (pvVar6 == (void *)0x0) {
          return 0;
        }
        arr->pageTable[lVar11] = pvVar6;
        lVar11 = lVar11 + 1;
        iVar3 = iVar9;
      } while (iVar9 != lVar11);
    }
    arr->capacity = iVar3 << 4;
  }
  return 1;
}

Assistant:

deBool			dePoolArray_reserve			(dePoolArray* arr, int size)
{
	if (size >= arr->capacity)
	{
		void*	oldPageTable			= DE_NULL;
		int		oldPageTableSize		= 0;

		int		newCapacity				= deAlign32(size, 1 << DE_ARRAY_ELEMENTS_PER_PAGE_LOG2);
		int		reqPageTableCapacity	= newCapacity >> DE_ARRAY_ELEMENTS_PER_PAGE_LOG2;

		if (arr->pageTableCapacity < reqPageTableCapacity)
		{
			int		newPageTableCapacity	= deMax32(2*arr->pageTableCapacity, reqPageTableCapacity);
			void**	newPageTable			= (void**)deMemPool_alloc(arr->pool, (size_t)newPageTableCapacity * sizeof(void*));
			int		i;

			if (!newPageTable)
				return DE_FALSE;

			for (i = 0; i < arr->pageTableCapacity; i++)
				newPageTable[i] = arr->pageTable[i];

			for (; i < newPageTableCapacity; i++)
				newPageTable[i] = DE_NULL;

			/* Grab information about old page table for recycling purposes. */
			oldPageTable		= arr->pageTable;
			oldPageTableSize	= arr->pageTableCapacity * (int)sizeof(void*);

			arr->pageTable			= newPageTable;
			arr->pageTableCapacity	= newPageTableCapacity;
		}

		/* Allocate new pages. */
		{
			int pageAllocSize = arr->elementSize << DE_ARRAY_ELEMENTS_PER_PAGE_LOG2;
			int pageTableNdx = arr->capacity >> DE_ARRAY_ELEMENTS_PER_PAGE_LOG2;

			/* Allocate new pages from recycled old page table. */
			while (oldPageTableSize >= pageAllocSize)
			{
				void* newPage = oldPageTable;
				DE_ASSERT(arr->pageTableCapacity > pageTableNdx); /* \todo [petri] is this always true? */
				DE_ASSERT(!arr->pageTable[pageTableNdx]);
				arr->pageTable[pageTableNdx++] = newPage;

				oldPageTable = (void*)((deUint8*)oldPageTable + pageAllocSize);
				oldPageTableSize -= pageAllocSize;
			}

			/* Allocate the rest of the needed pages from the pool. */
			for (; pageTableNdx < reqPageTableCapacity; pageTableNdx++)
			{
				void* newPage = deMemPool_alloc(arr->pool, (size_t)pageAllocSize);
				if (!newPage)
					return DE_FALSE;

				DE_ASSERT(!arr->pageTable[pageTableNdx]);
				arr->pageTable[pageTableNdx] = newPage;
			}

			arr->capacity = pageTableNdx << DE_ARRAY_ELEMENTS_PER_PAGE_LOG2;
			DE_ASSERT(arr->capacity >= newCapacity);
		}
	}

	return DE_TRUE;
}